

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint32_t __thiscall google::protobuf::io::CodedInputStream::ReadTagSlow(CodedInputStream *this)

{
  bool bVar1;
  uint64_t local_28;
  uint64_t result;
  CodedInputStream *pCStack_18;
  int current_position;
  CodedInputStream *this_local;
  
  pCStack_18 = this;
  if ((this->buffer_ != this->buffer_end_) || (bVar1 = Refresh(this), bVar1)) {
    local_28 = 0;
    bVar1 = ReadVarint64(this,&local_28);
    if (bVar1) {
      this_local._4_4_ = (uint32_t)local_28;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    if (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_) {
      this->legitimate_message_end_ = true;
    }
    else {
      this->legitimate_message_end_ = this->current_limit_ == this->total_bytes_limit_;
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CodedInputStream::ReadTagSlow() {
  if (buffer_ == buffer_end_) {
    // Call refresh.
    if (!Refresh()) {
      // Refresh failed.  Make sure that it failed due to EOF, not because
      // we hit total_bytes_limit_, which, unlike normal limits, is not a
      // valid place to end a message.
      int current_position = total_bytes_read_ - buffer_size_after_limit_;
      if (current_position >= total_bytes_limit_) {
        // Hit total_bytes_limit_.  But if we also hit the normal limit,
        // we're still OK.
        legitimate_message_end_ = current_limit_ == total_bytes_limit_;
      } else {
        legitimate_message_end_ = true;
      }
      return 0;
    }
  }

  // For the slow path, just do a 64-bit read. Try to optimize for one-byte tags
  // again, since we have now refreshed the buffer.
  uint64_t result = 0;
  if (!ReadVarint64(&result)) return 0;
  return static_cast<uint32_t>(result);
}